

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashPtr,_btCollisionObject_*>::insert
          (btHashMap<btHashPtr,_btCollisionObject_*> *this,btHashPtr *key,btCollisionObject **value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int n;
  int iVar4;
  int iVar5;
  btCollisionObject **ppbVar6;
  int *piVar7;
  undefined8 *in_RDX;
  btHashPtr *in_RSI;
  btAlignedObjectArray<int> *in_RDI;
  int newCapacity;
  int oldCapacity;
  int count;
  int index;
  int hash;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  btAlignedObjectArray<btHashPtr> *in_stack_ffffffffffffffc0;
  btCollisionObject *pbVar8;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar1 = btHashPtr::getHash(in_RSI);
  iVar2 = btAlignedObjectArray<btCollisionObject_*>::capacity
                    ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2));
  uVar3 = uVar1 & iVar2 - 1U;
  iVar2 = findIndex((btHashMap<btHashPtr,_btCollisionObject_*> *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (btHashPtr *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
  if (iVar2 == -1) {
    n = btAlignedObjectArray<btCollisionObject_*>::size
                  ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2));
    iVar4 = btAlignedObjectArray<btCollisionObject_*>::capacity
                      ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2));
    btAlignedObjectArray<btCollisionObject_*>::push_back
              ((btAlignedObjectArray<btCollisionObject_*> *)in_stack_ffffffffffffffc0,
               (btCollisionObject **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    btAlignedObjectArray<btHashPtr>::push_back
              (in_stack_ffffffffffffffc0,
               (btHashPtr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar5 = btAlignedObjectArray<btCollisionObject_*>::capacity
                      ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2));
    if (iVar4 < iVar5) {
      growTables((btHashMap<btHashPtr,_btCollisionObject_*> *)CONCAT44(uVar3,iVar2),
                 (btHashPtr *)CONCAT44(n,iVar4));
      uVar3 = btHashPtr::getHash(in_RSI);
      iVar2 = btAlignedObjectArray<btCollisionObject_*>::capacity
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2));
      uVar3 = uVar3 & iVar2 - 1U;
    }
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    iVar2 = *piVar7;
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI + 1,n);
    *piVar7 = iVar2;
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    *piVar7 = n;
  }
  else {
    pbVar8 = (btCollisionObject *)*in_RDX;
    ppbVar6 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 2),iVar2);
    *ppbVar6 = pbVar8;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}